

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O3

void __thiscall grid::grid(grid *this,int size)

{
  bool *pbVar1;
  ulong uVar2;
  int j;
  entity ***pppeVar3;
  entity **ppeVar4;
  ulong uVar5;
  bool **ppbVar6;
  bool *pbVar7;
  int j_1;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  vector<entity_*,_std::allocator<entity_*>_> entitiesToBeAdded;
  vector<entity_*,_std::allocator<entity_*>_> local_60;
  vector<entity_*,_std::allocator<entity_*>_> local_48;
  
  uVar2 = (ulong)(uint)size;
  this->_vptr_grid = (_func_int **)&PTR__grid_0010ac80;
  this->size = size;
  this->medkitsDiscovered = false;
  this->zombiesVisible = false;
  this->ammunitionDiscovered = false;
  this->directionOperations[0] = (int  [2])0xffffffff;
  this->directionOperations[1] = (int  [2])0x1ffffffff;
  this->directionOperations[2] = (int  [2])0x100000000;
  this->directionOperations[3] = (int  [2])0x100000001;
  this->directionOperations[4] = (int  [2])0x1;
  this->directionOperations[5] = (int  [2])0xffffffff00000001;
  this->directionOperations[6] = (int  [2])0xffffffff00000000;
  this->directionOperations[7] = (int  [2])0xffffffffffffffff;
  uVar10 = (ulong)size;
  uVar9 = 0xffffffffffffffff;
  if (-1 < size) {
    uVar9 = uVar10 * 8;
  }
  pppeVar3 = (entity ***)operator_new__(uVar9);
  this->board = pppeVar3;
  if (0 < size) {
    uVar8 = 0;
    do {
      ppeVar4 = (entity **)operator_new__(uVar9);
      this->board[uVar8] = ppeVar4;
      uVar5 = 0;
      do {
        this->board[uVar8][uVar5] = (entity *)0x0;
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar2);
  }
  ppbVar6 = (bool **)operator_new__(uVar9);
  this->visitedByChichonne = ppbVar6;
  ppbVar6 = (bool **)operator_new__(uVar9);
  this->visitedByDerek = ppbVar6;
  if (0 < size) {
    uVar9 = 0;
    do {
      pbVar7 = (bool *)operator_new__(uVar10);
      this->visitedByChichonne[uVar9] = pbVar7;
      pbVar7 = (bool *)operator_new__(uVar10);
      this->visitedByDerek[uVar9] = pbVar7;
      pbVar7 = this->visitedByChichonne[uVar9];
      pbVar1 = this->visitedByDerek[uVar9];
      uVar8 = 0;
      do {
        pbVar7[uVar8] = false;
        pbVar1[uVar8] = false;
        uVar8 = uVar8 + 1;
      } while (uVar2 != uVar8);
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar2);
  }
  createEntities(&local_48,this);
  std::vector<entity_*,_std::allocator<entity_*>_>::vector(&local_60,&local_48);
  deploy(this,&local_60);
  if (local_60.super__Vector_base<entity_*,_std::allocator<entity_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<entity_*,_std::allocator<entity_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<entity_*,_std::allocator<entity_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<entity_*,_std::allocator<entity_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<entity_*,_std::allocator<entity_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<entity_*,_std::allocator<entity_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<entity_*,_std::allocator<entity_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<entity_*,_std::allocator<entity_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

grid::grid(int size) : size(size),zombiesVisible(false), medkitsDiscovered(false), ammunitionDiscovered(false) {
    board = new entity **[size];
    for (int i = 0; i < size; ++i) {
        board[i] = new entity *[size];
        for (int j = 0; j < size; ++j) {
            board[i][j] = nullptr;
        }
    }

    visitedByChichonne = new bool*[size];
    visitedByDerek = new bool*[size];
    for (int i = 0; i < size; ++i) {
        visitedByChichonne[i] = new bool[size];
        visitedByDerek[i] = new bool[size];
        for (int j = 0; j < size; ++j) {
            visitedByChichonne[i][j] = false;
            visitedByDerek[i][j] = false;
        }
    }
    std::vector<entity *> entitiesToBeAdded = createEntities();
    deploy(entitiesToBeAdded);
}